

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_io.cc
# Opt level: O0

Ptr __thiscall core::image::load_ppm_16_file(image *this,string *filename)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Ptr PVar1;
  shared_ptr<core::ImageBase> local_28;
  string *local_18;
  string *filename_local;
  
  local_18 = filename;
  filename_local = (string *)this;
  load_ppm_file_intern((image *)&local_28,filename,false);
  std::dynamic_pointer_cast<core::Image<unsigned_short>,core::ImageBase>
            ((shared_ptr<core::ImageBase> *)this);
  std::shared_ptr<core::ImageBase>::~shared_ptr(&local_28);
  PVar1.super___shared_ptr<core::Image<unsigned_short>,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  PVar1.super___shared_ptr<core::Image<unsigned_short>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (Ptr)PVar1.super___shared_ptr<core::Image<unsigned_short>,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

RawImage::Ptr
load_ppm_16_file (std::string const& filename)
{
    return std::dynamic_pointer_cast<RawImage>
        (load_ppm_file_intern(filename, false));
}